

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

void SzAr_Free(CSzAr *p,ISzAlloc *alloc)

{
  ISzAlloc *alloc_local;
  CSzAr *p_local;
  
  (*alloc->Free)(alloc,p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs,alloc);
  (*alloc->Free)(alloc,p->FoCodersOffsets);
  (*alloc->Free)(alloc,p->FoStartPackStreamIndex);
  (*alloc->Free)(alloc,p->FoToCoderUnpackSizes);
  (*alloc->Free)(alloc,p->FoToMainUnpackSizeIndex);
  (*alloc->Free)(alloc,p->CoderUnpackSizes);
  (*alloc->Free)(alloc,p->CodersData);
  SzAr_Init(p);
  return;
}

Assistant:

static void SzAr_Free(CSzAr *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs, alloc);
 
  IAlloc_Free(alloc, p->FoCodersOffsets);
  IAlloc_Free(alloc, p->FoStartPackStreamIndex);
  IAlloc_Free(alloc, p->FoToCoderUnpackSizes);
  IAlloc_Free(alloc, p->FoToMainUnpackSizeIndex);
  IAlloc_Free(alloc, p->CoderUnpackSizes);
  
  IAlloc_Free(alloc, p->CodersData);

  SzAr_Init(p);
}